

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdct.c
# Opt level: O2

void mdct_butterfly_16(float *x)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  fVar5 = *x;
  fVar6 = x[1];
  fVar1 = x[10];
  fVar2 = x[0xb];
  fVar3 = x[0xe];
  fVar4 = x[0xf];
  fVar7 = fVar5 - x[8];
  fVar8 = fVar6 - x[9];
  *x = (fVar8 + fVar7) * 0.70710677;
  x[1] = (fVar8 - fVar7) * 0.70710677;
  x[8] = fVar5 + x[8];
  x[9] = fVar6 + x[9];
  x[10] = x[2] + fVar1;
  x[0xb] = x[3] + fVar2;
  *(ulong *)(x + 2) = CONCAT44(fVar1 - x[2],x[3] - fVar2);
  fVar5 = x[0xc] - x[4];
  fVar6 = x[0xd] - x[5];
  x[0xc] = x[0xc] + x[4];
  x[0xd] = x[0xd] + x[5];
  x[0xe] = fVar3 + x[6];
  x[0xf] = fVar4 + x[7];
  x[4] = (fVar5 - fVar6) * 0.70710677;
  x[5] = (fVar6 + fVar5) * 0.70710677;
  x[6] = fVar3 - x[6];
  x[7] = fVar4 - x[7];
  mdct_butterfly_8(x);
  mdct_butterfly_8(x + 8);
  return;
}

Assistant:

STIN void mdct_butterfly_16(DATA_TYPE *x){
  REG_TYPE r0     = x[1]  - x[9];
  REG_TYPE r1     = x[0]  - x[8];

           x[8]  += x[0];
           x[9]  += x[1];
           x[0]   = MULT_NORM((r0   + r1) * cPI2_8);
           x[1]   = MULT_NORM((r0   - r1) * cPI2_8);

           r0     = x[3]  - x[11];
           r1     = x[10] - x[2];
           x[10] += x[2];
           x[11] += x[3];
           x[2]   = r0;
           x[3]   = r1;

           r0     = x[12] - x[4];
           r1     = x[13] - x[5];
           x[12] += x[4];
           x[13] += x[5];
           x[4]   = MULT_NORM((r0   - r1) * cPI2_8);
           x[5]   = MULT_NORM((r0   + r1) * cPI2_8);

           r0     = x[14] - x[6];
           r1     = x[15] - x[7];
           x[14] += x[6];
           x[15] += x[7];
           x[6]  = r0;
           x[7]  = r1;

           mdct_butterfly_8(x);
           mdct_butterfly_8(x+8);
}